

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall
QTableModel::setHeaderData
          (QTableModel *this,int section,Orientation orientation,QVariant *value,int role)

{
  qsizetype qVar1;
  const_reference ppQVar2;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  QTableWidgetItem *itm;
  QTableWidgetItem *pQVar3;
  bool local_1;
  
  if (in_ESI < 0) {
LAB_008d7d3b:
    local_1 = false;
  }
  else {
    if (in_EDX == 1) {
      qVar1 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x48));
      if (qVar1 <= in_ESI) goto LAB_008d7d3b;
    }
    if (in_EDX == 2) {
      qVar1 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x30));
      if (qVar1 <= in_ESI) goto LAB_008d7d3b;
    }
    if (in_EDX == 1) {
      ppQVar2 = QList<QTableWidgetItem_*>::at((QList<QTableWidgetItem_*> *)0x0,in_RDI);
      pQVar3 = *ppQVar2;
    }
    else {
      ppQVar2 = QList<QTableWidgetItem_*>::at((QList<QTableWidgetItem_*> *)0x0,in_RDI);
      pQVar3 = *ppQVar2;
    }
    if (pQVar3 == (QTableWidgetItem *)0x0) {
      local_1 = false;
    }
    else {
      (*pQVar3->_vptr_QTableWidgetItem[4])(pQVar3,(ulong)in_R8D,in_RCX);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool QTableModel::setHeaderData(int section, Qt::Orientation orientation,
                                const QVariant &value, int role)
{
    if (section < 0 ||
       (orientation == Qt::Horizontal && horizontalHeaderItems.size() <= section) ||
       (orientation == Qt::Vertical && verticalHeaderItems.size() <= section))
    return false;

    QTableWidgetItem *itm = nullptr;
    if (orientation == Qt::Horizontal)
        itm = horizontalHeaderItems.at(section);
    else
        itm = verticalHeaderItems.at(section);
    if (itm) {
        itm->setData(role, value);
        return true;
    }
    return false;
}